

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

void __thiscall gdsForge::gdsARef(gdsForge *this,gdsAREF *in_AREF,bool minimal)

{
  string local_a8;
  int local_88;
  int local_84;
  int corXY [6];
  int colrow [2];
  double arrDou [1];
  bitset<16UL> local_58;
  bitset<16UL> bits;
  string local_40;
  uint local_20;
  byte local_19;
  int data [1];
  bool minimal_local;
  gdsAREF *in_AREF_local;
  gdsForge *this_local;
  
  local_19 = minimal;
  _data = in_AREF;
  GDSwriteRec(this,0xb00);
  if ((local_19 & 1) == 0) {
    local_20 = _data->plex;
    GDSwriteInt(this,0x2f03,(int *)&local_20,1);
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&_data->name);
  GDSwriteStr(this,0x1206,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::bitset<16UL>::bitset(&local_58);
  std::bitset<16UL>::set(&local_58,0xf,(bool)(_data->reflection & 1));
  if ((_data->scale != 1.0) || (NAN(_data->scale))) {
    std::bitset<16UL>::set(&local_58,2,true);
  }
  else {
    std::bitset<16UL>::set(&local_58,2,false);
  }
  if ((_data->angle != 0.0) || (NAN(_data->angle))) {
    std::bitset<16UL>::set(&local_58,1,true);
  }
  else {
    std::bitset<16UL>::set(&local_58,1,false);
  }
  GDSwriteBitArr(this,0x1a01,local_58);
  if ((_data->scale != 1.0) || (NAN(_data->scale))) {
    colrow = (int  [2])_data->scale;
    GDSwriteRea(this,0x1b05,(double *)colrow,1);
  }
  if ((_data->angle != 0.0) || (NAN(_data->angle))) {
    colrow = (int  [2])_data->angle;
    GDSwriteRea(this,0x1c05,(double *)colrow,1);
  }
  corXY[4] = _data->colCnt;
  corXY[5] = _data->rowCnt;
  GDSwriteInt(this,0x1302,corXY + 4,2);
  local_88 = _data->xCor;
  local_84 = _data->yCor;
  corXY[0] = _data->xCorRow;
  corXY[1] = _data->yCorRow;
  corXY[2] = _data->xCorCol;
  corXY[3] = _data->yCorCol;
  GDSwriteInt(this,0x1003,&local_88,6);
  if ((local_19 & 1) == 0) {
    local_20 = _data->propattr;
    GDSwriteInt(this,0x2b02,(int *)&local_20,1);
    std::__cxx11::string::string((string *)&local_a8,(string *)&_data->propvalue);
    GDSwriteStr(this,0x2c06,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsARef(const gdsAREF &in_AREF, bool minimal)
{
  int data[1];
  this->GDSwriteRec(GDS_AREF);

  // ELFLAGS and PLEX are optional
  if (minimal == false) {
    data[0] = in_AREF.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // name of the structure that is referenced
  this->GDSwriteStr(GDS_SNAME, in_AREF.name);

  // two byte, bit array controlling reflection, magnification and rotation.
  bitset<16> bits;

  // reflect across x-axis
  bits.set(15, in_AREF.reflection);

  // magnification, default 1
  if (in_AREF.scale == 1)
    bits.set(2, 0);
  else
    bits.set(2, 1);

  // angle of rotation
  if (in_AREF.angle == 0)
    bits.set(1, 0);
  else
    bits.set(1, 1);

  this->GDSwriteBitArr(GDS_STRANS, bits);

  double arrDou[1];
  // Magnification, default 1
  if (in_AREF.scale != 1) {
    arrDou[0] = in_AREF.scale;
    this->GDSwriteRea(GDS_MAG, arrDou, 1);
  }

  // Angle measured counterclockwise
  if (in_AREF.angle != 0) {
    arrDou[0] = in_AREF.angle;
    this->GDSwriteRea(GDS_ANGLE, arrDou, 1);
  }

  int colrow[2];
  colrow[0] = in_AREF.colCnt;
  colrow[1] = in_AREF.rowCnt;
  this->GDSwriteInt(GDS_COLROW, colrow, 2);

  int corXY[6];
  corXY[0] = in_AREF.xCor;
  corXY[1] = in_AREF.yCor;
  corXY[2] = in_AREF.xCorRow;
  corXY[3] = in_AREF.yCorRow;
  corXY[4] = in_AREF.xCorCol;
  corXY[5] = in_AREF.yCorCol;
  this->GDSwriteInt(GDS_XY, corXY, 6);

  // Optional goodies
  if (minimal == false) {
    data[0] = in_AREF.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);
    this->GDSwriteStr(GDS_PROPVALUE, in_AREF.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}